

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveglsl.cpp
# Opt level: O0

LiveGLSL * LiveGLSLCreate(Arguments *args)

{
  int iVar1;
  LiveGLSL *this;
  HFileWatcher pvVar2;
  GLFWwindow *pGVar3;
  _func_void_int_char_ptr *cbfun;
  _func_void_GLFWwindow_ptr_int_int *p_Var4;
  _func_void_GLFWwindow_ptr_int_int_int_int *cbfun_00;
  _func_void_GLFWwindow_ptr_int_char_ptr_ptr *cbfun_01;
  _func_void_GLFWwindow_ptr_int_int_int *cbfun_02;
  HGUI pvVar5;
  undefined1 local_128 [8];
  float vertices [12];
  int local_d4;
  int local_d0;
  int fb_height;
  int fb_width;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [8];
  string shader_name;
  LiveGLSL *live_glsl;
  Arguments *args_local;
  
  this = (LiveGLSL *)operator_new(0xf0);
  memset(this,0,0xf0);
  LiveGLSL::LiveGLSL(this);
  std::atomic<bool>::store(&this->ShaderFileChanged,false,memory_order_seq_cst);
  pvVar2 = FileWatcherCreate(OnShaderChange,this,0x10);
  this->FileWatcher = pvVar2;
  this->ShaderCompiled = false;
  std::__cxx11::string::operator=((string *)&this->ShaderPath,(string *)args);
  this->WindowWidth = args->Width;
  this->WindowHeight = args->Height;
  this->IsContinuousRendering = false;
  Arguments::operator=(&this->Args,args);
  ExtractBasePath((string *)((long)&shader_name.field_2 + 8),&args->Input);
  std::__cxx11::string::operator=
            ((string *)&this->BasePath,(string *)(shader_name.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(shader_name.field_2._M_local_buf + 8));
  if (((this->Args).EnableIni & 1U) != 0) {
    ExtractFilenameWithoutExt((string *)local_58,&args->Input);
    std::operator+(&local_b8,&this->BasePath,"/");
    std::operator+(&local_98,&local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
    std::operator+(&local_78,&local_98,".ini");
    GUIComponentLoad(&local_78,(vector<GUIComponent,_std::allocator<GUIComponent>_> *)this);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)local_58);
  }
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    glfwTerminate();
    exit(1);
  }
  glfwWindowHint(0x22002,3);
  glfwWindowHint(0x22003,2);
  glfwWindowHint(0x22006,1);
  glfwWindowHint(0x22008,0x32001);
  glfwWindowHint(0x2100d,4);
  pGVar3 = glfwCreateWindow(this->WindowWidth,this->WindowHeight,"live-glsl",(GLFWmonitor *)0x0,
                            (GLFWwindow *)0x0);
  this->GLFWWindowHandle = pGVar3;
  if (this->GLFWWindowHandle == (GLFWwindow *)0x0) {
    glfwTerminate();
    exit(1);
  }
  glfwMakeContextCurrent(this->GLFWWindowHandle);
  glfwSetWindowUserPointer(this->GLFWWindowHandle,this);
  cbfun = LiveGLSLCreate(Arguments_const&)::$_0::operator_cast_to_function_pointer
                    ((__0 *)((long)&fb_width + 3));
  glfwSetErrorCallback(cbfun);
  pGVar3 = this->GLFWWindowHandle;
  p_Var4 = LiveGLSLCreate(Arguments_const&)::$_1::operator_cast_to_function_pointer
                     ((__1 *)((long)&fb_width + 2));
  glfwSetWindowSizeCallback(pGVar3,p_Var4);
  pGVar3 = this->GLFWWindowHandle;
  p_Var4 = LiveGLSLCreate(Arguments_const&)::$_2::operator_cast_to_function_pointer
                     ((__2 *)((long)&fb_width + 1));
  glfwSetFramebufferSizeCallback(pGVar3,p_Var4);
  pGVar3 = this->GLFWWindowHandle;
  cbfun_00 = LiveGLSLCreate(Arguments_const&)::$_3::operator_cast_to_function_pointer
                       ((__3 *)&fb_width);
  glfwSetKeyCallback(pGVar3,cbfun_00);
  pGVar3 = this->GLFWWindowHandle;
  cbfun_01 = LiveGLSLCreate(Arguments_const&)::$_4::operator_cast_to_function_pointer
                       ((__4 *)((long)&fb_height + 3));
  glfwSetDropCallback(pGVar3,cbfun_01);
  pGVar3 = this->GLFWWindowHandle;
  cbfun_02 = LiveGLSLCreate(Arguments_const&)::$_5::operator_cast_to_function_pointer
                       ((__5 *)((long)&fb_height + 2));
  glfwSetMouseButtonCallback(pGVar3,cbfun_02);
  local_d0 = 0;
  local_d4 = 0;
  glfwGetFramebufferSize(this->GLFWWindowHandle,&local_d0,&local_d4);
  this->PixelDensity = (float)local_d0 / (float)this->WindowWidth;
  gladLoadGL(glfwGetProcAddress);
  glfwSwapInterval(1);
  pvVar5 = GUIInit(this->GLFWWindowHandle,args->Width,args->Height);
  this->GUI = pvVar5;
  std::__cxx11::string::string((string *)(vertices + 10),(string *)args);
  ReloadShaderIfChanged(this,(string *)(vertices + 10),true);
  std::__cxx11::string::~string((string *)(vertices + 10));
  (*glad_glClearColor)(0.21,0.39,0.74,1.0);
  memcpy(local_128,&DAT_00195780,0x30);
  (*glad_glGenVertexArrays)(1,&this->VaoId);
  (*glad_glBindVertexArray)(this->VaoId);
  (*glad_glGenBuffers)(1,&this->VertexBufferId);
  (*glad_glBindBuffer)(0x8892,this->VertexBufferId);
  (*glad_glBufferData)(0x8892,0x30,local_128,0x88e4);
  return this;
}

Assistant:

LiveGLSL* LiveGLSLCreate(const Arguments& args) {
    LiveGLSL* live_glsl = new LiveGLSL();

    live_glsl->ShaderFileChanged.store(false);
    live_glsl->FileWatcher = FileWatcherCreate(OnShaderChange, live_glsl, 16);
    live_glsl->ShaderCompiled = false;
    live_glsl->ShaderPath = args.Input;
    live_glsl->WindowWidth = args.Width;
    live_glsl->WindowHeight = args.Height;
    live_glsl->IsContinuousRendering = false;
    live_glsl->Args = args;
    live_glsl->BasePath = ExtractBasePath(args.Input);
    
    if (live_glsl->Args.EnableIni) {
        std::string shader_name = ExtractFilenameWithoutExt(args.Input);
        GUIComponentLoad(live_glsl->BasePath + "/" + shader_name + ".ini", live_glsl->GUIComponents);
    }

    // Init GLFW Window
    {
        if (!glfwInit()) {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 3);
        glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 2);
        glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GL_TRUE);
        glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);
        glfwWindowHint(GLFW_SAMPLES, 4);

        live_glsl->GLFWWindowHandle = glfwCreateWindow(live_glsl->WindowWidth, live_glsl->WindowHeight, "live-glsl", NULL, NULL);
        if (!live_glsl->GLFWWindowHandle) {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        glfwMakeContextCurrent(live_glsl->GLFWWindowHandle);
        glfwSetWindowUserPointer(live_glsl->GLFWWindowHandle, live_glsl);
        glfwSetErrorCallback([](int error, const char* description) {
            fprintf(stderr, "Error: %s\n", description);
        });

        glfwSetWindowSizeCallback(live_glsl->GLFWWindowHandle, [](GLFWwindow* window, int width, int height) {
            LiveGLSL* live_glsl = static_cast<LiveGLSL*>(glfwGetWindowUserPointer(window));
            live_glsl->WindowWidth = width;
            live_glsl->WindowHeight = height;
        });

        glfwSetFramebufferSizeCallback(live_glsl->GLFWWindowHandle, [](GLFWwindow* window, int fb_width, int fb_height) {
            LiveGLSL* live_glsl = static_cast<LiveGLSL*>(glfwGetWindowUserPointer(window));
            int window_width = 0;
            int window_height = 0;
            glfwGetWindowSize(live_glsl->GLFWWindowHandle, &window_width, &window_height);
            live_glsl->PixelDensity = (float)fb_width / (float)window_width;
            GUIResize(live_glsl->GUI, window_width, window_height);
        });

        glfwSetKeyCallback(live_glsl->GLFWWindowHandle, [](GLFWwindow* window, int key, int scancode, int action, int mods) {
            if (key == GLFW_KEY_ESCAPE) glfwSetWindowShouldClose(window, GL_TRUE);
            GUIKeyCallback(window, key, scancode, action, mods);
        });

        glfwSetDropCallback(live_glsl->GLFWWindowHandle, [](GLFWwindow* window, int count, const char** paths) {
            if (count >= 0) {
                LiveGLSL* live_glsl = static_cast<LiveGLSL*>(glfwGetWindowUserPointer(window));
                std::string path = std::string(paths[0]);
                live_glsl->ShaderPath = path;
                live_glsl->Args.Input = path;
                live_glsl->BasePath = ExtractBasePath(path);

                ReloadShaderIfChanged(live_glsl, path, true);
            }
        });
        
        glfwSetMouseButtonCallback(live_glsl->GLFWWindowHandle, [](GLFWwindow* window, int button, int action, int mods) {
            LiveGLSL* live_glsl = static_cast<LiveGLSL*>(glfwGetWindowUserPointer(window));
            GUIMouseButtonCallback(live_glsl->GUI, button, action, mods);
        });

        int fb_width = 0;
        int fb_height = 0;
        glfwGetFramebufferSize(live_glsl->GLFWWindowHandle, &fb_width, &fb_height);
        live_glsl->PixelDensity = (float)fb_width / (float)live_glsl->WindowWidth;
        gladLoadGL(glfwGetProcAddress);
        glfwSwapInterval(1);
    }

    live_glsl->GUI = GUIInit(live_glsl->GLFWWindowHandle, args.Width, args.Height);

    ReloadShaderIfChanged(live_glsl, args.Input, true);

    // Init GL
    {
        glClearColor(0.21, 0.39, 0.74, 1.0);
        const float vertices[] = {
            -1.0f,  1.0f,
             1.0f, -1.0f,
             1.0f,  1.0f,
            -1.0f,  1.0f,
            -1.0f, -1.0f,
             1.0f, -1.0f,
        };

        glGenVertexArrays(1, &live_glsl->VaoId);
        glBindVertexArray(live_glsl->VaoId);
        glGenBuffers(1, &live_glsl->VertexBufferId);
        glBindBuffer(GL_ARRAY_BUFFER, live_glsl->VertexBufferId);
        glBufferData(GL_ARRAY_BUFFER, sizeof(vertices), vertices, GL_STATIC_DRAW);
    }

    return live_glsl;
}